

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O2

int add_linux_if(pcap_if_t **devlistp,char *ifname,int fd,char *errbuf)

{
  char cVar1;
  ushort *puVar2;
  int iVar3;
  bpf_u_int32 flags;
  ushort **ppuVar4;
  int *piVar5;
  long lVar6;
  byte bVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  ifreq ifrflags;
  char name [512];
  
  pcVar10 = ifname + 1;
  pcVar8 = name;
  while( true ) {
    cVar1 = pcVar10[-1];
    if ((long)cVar1 < 1) goto LAB_00118cd3;
    ppuVar4 = __ctype_b_loc();
    puVar2 = *ppuVar4;
    if ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0) goto LAB_00118cd3;
    if (cVar1 == ':') break;
    *pcVar8 = cVar1;
    pcVar8 = pcVar8 + 1;
    pcVar10 = pcVar10 + 1;
  }
  bVar7 = 0x3a;
  lVar6 = 0;
  while ((-1 < (char)bVar7 && ((*(byte *)((long)puVar2 + (ulong)bVar7 * 2 + 1) & 8) != 0))) {
    pcVar8[lVar6] = bVar7;
    bVar7 = pcVar10[lVar6];
    lVar6 = lVar6 + 1;
  }
  if (bVar7 == 0x3a) {
    pcVar8 = pcVar8 + lVar6;
  }
LAB_00118cd3:
  *pcVar8 = '\0';
  strncpy((char *)&ifrflags,name,0x10);
  ifrflags.ifr_ifrn.ifrn_name[0xf] = '\0';
  iVar3 = ioctl(fd,0x8913,&ifrflags);
  if (iVar3 < 0) {
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    iVar9 = 0;
    if ((iVar3 != 6) && (iVar9 = 0, iVar3 != 0x13)) {
      pcVar8 = pcap_strerror(iVar3);
      snprintf(errbuf,0x100,"SIOCGIFFLAGS: %.*s: %s",0x10,&ifrflags,pcVar8);
      iVar9 = -1;
    }
  }
  else {
    flags = if_flags_to_pcap_flags(name,(int)ifrflags.ifr_ifru.ifru_flags);
    iVar3 = pcap_add_if(devlistp,name,flags,(char *)0x0,errbuf);
    iVar9 = -(uint)(iVar3 == -1);
  }
  return iVar9;
}

Assistant:

static int
add_linux_if(pcap_if_t **devlistp, const char *ifname, int fd, char *errbuf)
{
	const char *p;
	char name[512];	/* XXX - pick a size */
	char *q, *saveq;
	struct ifreq ifrflags;

	/*
	 * Get the interface name.
	 */
	p = ifname;
	q = &name[0];
	while (*p != '\0' && isascii(*p) && !isspace(*p)) {
		if (*p == ':') {
			/*
			 * This could be the separator between a
			 * name and an alias number, or it could be
			 * the separator between a name with no
			 * alias number and the next field.
			 *
			 * If there's a colon after digits, it
			 * separates the name and the alias number,
			 * otherwise it separates the name and the
			 * next field.
			 */
			saveq = q;
			while (isascii(*p) && isdigit(*p))
				*q++ = *p++;
			if (*p != ':') {
				/*
				 * That was the next field,
				 * not the alias number.
				 */
				q = saveq;
			}
			break;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	/*
	 * Get the flags for this interface.
	 */
	strlcpy(ifrflags.ifr_name, name, sizeof(ifrflags.ifr_name));
	if (ioctl(fd, SIOCGIFFLAGS, (char *)&ifrflags) < 0) {
		if (errno == ENXIO || errno == ENODEV)
			return (0);	/* device doesn't actually exist - ignore it */
		(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
		    "SIOCGIFFLAGS: %.*s: %s",
		    (int)sizeof(ifrflags.ifr_name),
		    ifrflags.ifr_name,
		    pcap_strerror(errno));
		return (-1);
	}

	/*
	 * Add an entry for this interface, with no addresses.
	 */
	if (pcap_add_if(devlistp, name,
	    if_flags_to_pcap_flags(name, ifrflags.ifr_flags), NULL,
	    errbuf) == -1) {
		/*
		 * Failure.
		 */
		return (-1);
	}

	return (0);
}